

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O0

void __thiscall
icu_63::CanonicalIterator::CanonicalIterator
          (CanonicalIterator *this,UnicodeString *sourceStr,UErrorCode *status)

{
  UBool UVar1;
  Normalizer2 *pNVar2;
  Normalizer2Impl *pNVar3;
  UErrorCode *status_local;
  UnicodeString *sourceStr_local;
  CanonicalIterator *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CanonicalIterator_004f53b0;
  UnicodeString::UnicodeString(&this->source);
  this->pieces = (UnicodeString **)0x0;
  this->pieces_length = 0;
  this->pieces_lengths = (int32_t *)0x0;
  this->current = (int32_t *)0x0;
  this->current_length = 0;
  UnicodeString::UnicodeString(&this->buffer);
  pNVar2 = Normalizer2::getNFDInstance(status);
  this->nfd = pNVar2;
  pNVar3 = Normalizer2Factory::getNFCImpl(status);
  this->nfcImpl = pNVar3;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    UVar1 = Normalizer2Impl::ensureCanonIterData(this->nfcImpl,status);
    if (UVar1 != '\0') {
      setSource(this,sourceStr,status);
    }
  }
  return;
}

Assistant:

CanonicalIterator::CanonicalIterator(const UnicodeString &sourceStr, UErrorCode &status) :
    pieces(NULL),
    pieces_length(0),
    pieces_lengths(NULL),
    current(NULL),
    current_length(0),
    nfd(*Normalizer2::getNFDInstance(status)),
    nfcImpl(*Normalizer2Factory::getNFCImpl(status))
{
    if(U_SUCCESS(status) && nfcImpl.ensureCanonIterData(status)) {
      setSource(sourceStr, status);
    }
}